

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O3

int64_t HistoQueuePush(HistoQueue *histo_queue,VP8LHistogram **histograms,int idx1,int idx2,
                      int64_t threshold)

{
  HistogramPair *pHVar1;
  int64_t iVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  int64_t iVar9;
  uint64_t uVar10;
  uint64_t uVar11;
  uint64_t uVar12;
  uint64_t uVar13;
  uint64_t uVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  HistogramPair tmp;
  HistogramPair pair;
  HistogramPair local_48;
  
  if (histo_queue->size != histo_queue->max_size) {
    local_48.idx2 = idx2;
    if (idx2 < idx1) {
      local_48.idx2 = idx1;
    }
    if (idx1 < idx2) {
      idx2 = idx1;
    }
    local_48.idx1 = idx2;
    iVar18 = HistoQueueUpdatePair(histograms[idx2],histograms[local_48.idx2],threshold,&local_48);
    if (iVar18 == 0) {
      local_48.cost_diff = 0;
    }
    else {
      pHVar1 = histo_queue->queue;
      iVar18 = histo_queue->size;
      histo_queue->size = iVar18 + 1;
      pHVar1[iVar18].costs[3] = local_48.costs[3];
      (pHVar1[iVar18].costs + 3)[1] = local_48.costs[4];
      pHVar1[iVar18].costs[1] = local_48.costs[1];
      (pHVar1[iVar18].costs + 1)[1] = local_48.costs[2];
      pHVar1[iVar18].cost_combo = local_48.cost_combo;
      (&pHVar1[iVar18].cost_combo)[1] = local_48.costs[0];
      pHVar1 = pHVar1 + iVar18;
      pHVar1->idx1 = local_48.idx1;
      pHVar1->idx2 = local_48.idx2;
      pHVar1->cost_diff = local_48.cost_diff;
      pHVar1 = histo_queue->queue;
      lVar19 = (long)histo_queue->size;
      if (pHVar1[lVar19 + -1].cost_diff < pHVar1->cost_diff) {
        iVar16 = pHVar1->idx1;
        iVar17 = pHVar1->idx2;
        iVar2 = pHVar1->cost_diff;
        uVar3 = pHVar1->cost_combo;
        uVar4 = pHVar1->costs[0];
        uVar5 = pHVar1->costs[1];
        uVar6 = pHVar1->costs[2];
        uVar7 = pHVar1->costs[3];
        uVar8 = pHVar1->costs[4];
        iVar18 = pHVar1[lVar19 + -1].idx1;
        iVar15 = pHVar1[lVar19 + -1].idx2;
        iVar9 = pHVar1[lVar19 + -1].cost_diff;
        uVar10 = pHVar1[lVar19 + -1].cost_combo;
        uVar11 = pHVar1[lVar19 + -1].costs[0];
        uVar12 = pHVar1[lVar19 + -1].costs[1];
        uVar13 = pHVar1[lVar19 + -1].costs[2];
        uVar14 = pHVar1[lVar19 + -1].costs[4];
        pHVar1->costs[3] = pHVar1[lVar19 + -1].costs[3];
        pHVar1->costs[4] = uVar14;
        pHVar1->costs[1] = uVar12;
        pHVar1->costs[2] = uVar13;
        pHVar1->cost_combo = uVar10;
        pHVar1->costs[0] = uVar11;
        pHVar1->idx1 = iVar18;
        pHVar1->idx2 = iVar15;
        pHVar1->cost_diff = iVar9;
        pHVar1[lVar19 + -1].costs[3] = uVar7;
        pHVar1[lVar19 + -1].costs[4] = uVar8;
        pHVar1[lVar19 + -1].costs[1] = uVar5;
        pHVar1[lVar19 + -1].costs[2] = uVar6;
        pHVar1[lVar19 + -1].cost_combo = uVar3;
        pHVar1[lVar19 + -1].costs[0] = uVar4;
        pHVar1[lVar19 + -1].idx1 = iVar16;
        pHVar1[lVar19 + -1].idx2 = iVar17;
        pHVar1[lVar19 + -1].cost_diff = iVar2;
      }
    }
    return local_48.cost_diff;
  }
  return 0;
}

Assistant:

static int64_t HistoQueuePush(HistoQueue* const histo_queue,
                              VP8LHistogram** const histograms, int idx1,
                              int idx2, int64_t threshold) {
  const VP8LHistogram* h1;
  const VP8LHistogram* h2;
  HistogramPair pair;

  // Stop here if the queue is full.
  if (histo_queue->size == histo_queue->max_size) return 0;
  assert(threshold <= 0);
  if (idx1 > idx2) {
    const int tmp = idx2;
    idx2 = idx1;
    idx1 = tmp;
  }
  pair.idx1 = idx1;
  pair.idx2 = idx2;
  h1 = histograms[idx1];
  h2 = histograms[idx2];

  // Do not even consider the pair if it does not improve the entropy.
  if (!HistoQueueUpdatePair(h1, h2, threshold, &pair)) return 0;

  histo_queue->queue[histo_queue->size++] = pair;
  HistoQueueUpdateHead(histo_queue, &histo_queue->queue[histo_queue->size - 1]);

  return pair.cost_diff;
}